

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg.h
# Opt level: O2

string * __thiscall
svg::Stroke::toString_abi_cxx11_(string *__return_storage_ptr__,Stroke *this,Layout *layout)

{
  ostream *poVar1;
  string *in_R8;
  stringstream local_2a0 [8];
  stringstream ss;
  ostream local_290 [376];
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98 [32];
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  double local_38;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  
  if (0.0 < this->width || this->width == 0.0) {
    std::__cxx11::stringstream::stringstream(local_2a0);
    std::__cxx11::string::string((string *)&local_f8,"stroke-width",&local_2c);
    local_38 = this->width * layout->scale;
    std::__cxx11::string::string((string *)&local_d8,"",&local_2b);
    attribute<double>(&local_118,&local_f8,&local_38,&local_d8);
    poVar1 = std::operator<<(local_290,(string *)&local_118);
    std::__cxx11::string::string(local_98,"stroke",&local_2a);
    Color::toString_abi_cxx11_(&local_78,&this->color,layout);
    std::__cxx11::string::string((string *)&local_58,"",&local_29);
    attribute<std::__cxx11::string>(&local_b8,(svg *)local_98,&local_78,&local_58,in_R8);
    std::operator<<(poVar1,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_2a0);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString(Layout const & layout) const
        {
            // If stroke width is invalid.
            if (width < 0)
                return std::string();

            std::stringstream ss;
            ss << attribute("stroke-width", translateScale(width, layout)) << attribute("stroke", color.toString(layout));
            return ss.str();
        }